

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O1

size_t PAL_wcscspn(char16_t *string,char16_t *strCharSet)

{
  char16_t cVar1;
  char16_t *pcVar2;
  size_t sVar3;
  char16_t cVar4;
  
  cVar4 = *string;
  if (cVar4 == L'\0') {
    return 0;
  }
  sVar3 = 0;
  cVar1 = *strCharSet;
  pcVar2 = strCharSet + 1;
  do {
    while (cVar1 != L'\0') {
      if (cVar4 == cVar1) {
        return sVar3;
      }
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    }
    sVar3 = sVar3 + 1;
    cVar4 = string[1];
    string = string + 1;
    cVar1 = *strCharSet;
    pcVar2 = strCharSet + 1;
  } while (cVar4 != L'\0');
  return sVar3;
}

Assistant:

size_t
__cdecl
PAL_wcscspn(const char16_t *string, const char16_t *strCharSet)
{
    const char16_t *temp;
    size_t count = 0;

    PERF_ENTRY(wcscspn);

    while(*string != 0)
    {
        for(temp = strCharSet; *temp != 0; temp++)
        {
            if (*string == *temp)
            {
                PERF_EXIT(wcscspn);
                return count;
            }
        }
        count++;
        string++;
    }
    PERF_EXIT(wcscspn);
    return count;
}